

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O3

FT_Error pfr_slot_load(FT_GlyphSlot pfrslot,FT_Size pfrsize,FT_UInt gindex,FT_Int32 load_flags)

{
  FT_GlyphSlot glyph;
  FT_Outline *outline;
  short sVar1;
  uint uVar2;
  FT_Face pFVar3;
  FT_Stream pFVar4;
  FT_Generic_Finalizer p_Var5;
  undefined8 uVar6;
  short *psVar7;
  FT_GlyphSlot pFVar8;
  FT_UInt format_00;
  FT_Error FVar9;
  uint uVar10;
  int iVar11;
  FT_Error FVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint *puVar18;
  int iVar19;
  uint uVar20;
  FT_Long FVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  FT_Vector *pFVar26;
  byte *pbVar27;
  byte *pbVar28;
  long lVar29;
  uint uVar30;
  uint uVar32;
  uint *puVar33;
  ulong uVar34;
  FT_UInt ysize;
  FT_UInt xsize;
  FT_GlyphSlot local_90;
  uint local_84;
  byte *local_80;
  uint local_78;
  FT_UInt format;
  FT_Long local_70;
  FT_Long ypos;
  uchar *local_60;
  FT_Long xpos;
  long lStack_50;
  long local_48;
  long lStack_40;
  uint uVar31;
  
  pFVar3 = pfrslot->face;
  uVar10 = gindex - 1;
  if (gindex == 0) {
    uVar10 = 0;
  }
  FVar9 = 6;
  if (pFVar3 == (FT_Face)0x0) {
    return 6;
  }
  if (*(uint *)&pFVar3[2].generic.data <= uVar10) {
    return 6;
  }
  local_90 = pfrslot;
  local_84 = load_flags;
  if (((load_flags & 9U) == 0) && (iVar11 = *(int *)&pFVar3[2].style_name, iVar11 != 0)) {
    puVar18 = (uint *)((ulong)uVar10 * 0x10 + pFVar3[2].bbox.xMin);
    pFVar4 = pFVar3->stream;
    puVar33 = (uint *)(*(long *)&pFVar3[2].num_fixed_sizes + 0x1c);
    do {
      if ((puVar33[-7] == (uint)(pfrsize->metrics).x_ppem) &&
         (puVar33[-6] == (uint)(pfrsize->metrics).y_ppem)) {
        uVar30 = puVar33[-5];
        FVar12 = FT_Stream_Seek(pFVar4,(ulong)puVar33[-1] + *(long *)&pFVar3[2].units_per_EM);
        if (FVar12 == 0) {
          iVar11 = (uVar30 & 1) + 5;
          if ((uVar30 & 2) == 0) {
            iVar11 = (uVar30 & 1) + 4;
          }
          FVar12 = FT_Stream_EnterFrame
                             (pFVar4,(ulong)((iVar11 + (uint)((uVar30 >> 2 & 1) != 0)) * *puVar33));
          if (FVar12 == 0) {
            pbVar28 = pFVar4->cursor;
            uVar30 = puVar33[-5];
            uVar24 = *puVar33;
            uVar2 = *puVar18;
            uVar20 = uVar30 & 1;
            iVar11 = uVar20 + 5;
            if ((uVar30 & 2) == 0) {
              iVar11 = uVar20 + 4;
            }
            uVar23 = iVar11 + (uint)((uVar30 >> 2 & 1) != 0);
            if ((uVar30 & 0x40) != 0) goto LAB_00229b53;
            local_78 = uVar30 | 0x80;
            local_80 = pbVar28 + uVar23 * uVar24;
            pbVar27 = pFVar4->limit;
            puVar33[-5] = local_78;
            if (pbVar27 < local_80) {
              uVar31 = uVar30 & 0xffffff3f;
              goto LAB_00229b4b;
            }
            uVar31 = local_78;
            if (uVar23 * uVar24 == 0) goto LAB_00229b4b;
            pbVar27 = pbVar28;
            uVar34 = 0xffffffffffffffff;
            goto LAB_00229b11;
          }
        }
        break;
      }
      puVar33 = puVar33 + 10;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  goto LAB_00229766;
  while (pbVar27 = pbVar27 + uVar23, uVar34 = uVar15, pbVar27 < local_80) {
LAB_00229b11:
    uVar15 = (ulong)*pbVar27;
    if (uVar20 != 0) {
      uVar15 = (ulong)CONCAT11(*pbVar27,pbVar27[1]);
    }
    if ((long)uVar15 <= (long)uVar34) {
      uVar31 = uVar30 & 0xffffff3f;
      break;
    }
  }
LAB_00229b4b:
  uVar30 = uVar31 | 0x40;
  puVar33[-5] = uVar30;
LAB_00229b53:
  if ((uVar24 != 0) && ((uVar30 & 0x80) != 0)) {
    uVar32 = uVar24 >> 1;
    uVar31 = 0;
    do {
      uVar34 = (ulong)(uVar32 * uVar23);
      uVar13 = (uint)pbVar28[uVar34];
      if (uVar20 == 0) {
        lVar14 = uVar34 + 1;
      }
      else {
        lVar14 = uVar34 + 2;
        uVar13 = (uint)CONCAT11(pbVar28[uVar34],pbVar28[uVar34 + 1]);
      }
      pbVar27 = pbVar28 + lVar14;
      uVar25 = uVar32;
      if (uVar2 >= uVar13) {
        if (uVar2 < uVar13 || uVar2 - uVar13 == 0) {
          uVar34 = (ulong)*pbVar27;
          if ((uVar30 & 2) == 0) {
            pbVar28 = pbVar27 + 1;
          }
          else {
            pbVar28 = pbVar27 + 2;
            uVar34 = (ulong)CONCAT11(*pbVar27,pbVar27[1]);
          }
          uVar15 = (ulong)pbVar28[1];
          if ((uVar30 & 4) == 0) {
            uVar17 = (ulong)*pbVar28 << 8;
          }
          else {
            uVar15 = (ulong)((uint)pbVar28[1] << 8 | (uint)*pbVar28 << 0x10);
            uVar17 = (ulong)pbVar28[2];
          }
          FT_Stream_ExitFrame(pFVar4);
          if (uVar34 == 0) goto LAB_00229766;
          xpos = 0;
          ypos = 0;
          xsize = 0;
          ysize = 0;
          format = 0;
          FVar21 = (FT_Long)(int)puVar18[1];
          uVar30 = *(uint *)((long)&pFVar3[1].driver + 4);
          lVar14 = FVar21;
          local_80 = (byte *)(uVar17 | uVar15);
          if (uVar30 != *(uint *)&pFVar3[1].driver) {
            FVar21 = FT_MulDiv(FVar21,(ulong)*(uint *)&pFVar3[1].driver,(ulong)uVar30);
            uVar30 = *(uint *)((long)&pFVar3[1].driver + 4);
            lVar14 = (long)(int)puVar18[1];
          }
          local_90->linearHoriAdvance = FVar21;
          FVar21 = FT_MulDiv((ulong)(pfrsize->metrics).x_ppem << 8,lVar14,(ulong)uVar30);
          local_70 = FVar21;
          FVar12 = FT_Stream_Seek(pFVar4,(FT_ULong)(local_80 + (uint)pFVar3[1].num_fixed_sizes));
          if ((FVar12 != 0) || (FVar12 = FT_Stream_EnterFrame(pFVar4,uVar34), FVar12 != 0))
          goto LAB_00229766;
          local_60 = pFVar4->cursor;
          FVar12 = pfr_load_bitmap_metrics
                             (&local_60,pFVar4->limit,FVar21,&xpos,&ypos,&xsize,&ysize,&local_70,
                              &format);
          format_00 = format;
          if (FVar12 != 0) break;
          if (format == 2) {
            uVar15 = (ulong)ysize * (ulong)xsize;
            uVar34 = (uVar34 + 1 >> 1) * 0xff;
LAB_00229dc0:
            if (uVar34 < uVar15) break;
          }
          else {
            if (format == 1) {
              uVar15 = (ulong)ysize * (ulong)xsize;
              uVar34 = uVar34 * 0xf;
              goto LAB_00229dc0;
            }
            if ((format != 0) || (uVar34 < (ulong)ysize * (ulong)xsize + 7 >> 3)) break;
          }
          if (((int)ysize < 0 || (int)xpos != xpos) ||
             (uVar34 = (ulong)ysize,
             (long)(ypos + uVar34) < -0x80000000 || (long)(uVar34 ^ 0x7fffffff) < ypos)) break;
          local_90->format = FT_GLYPH_FORMAT_BITMAP;
          (local_90->bitmap).width = xsize;
          (local_90->bitmap).rows = ysize;
          iVar11 = (int)(xsize + 7) >> 3;
          (local_90->bitmap).pitch = iVar11;
          (local_90->bitmap).pixel_mode = '\x01';
          (local_90->metrics).width = (ulong)xsize * 0x40;
          (local_90->metrics).height = uVar34 << 6;
          (local_90->metrics).horiBearingX = xpos << 6;
          (local_90->metrics).horiBearingY = ypos << 6;
          (local_90->metrics).horiAdvance = (local_70 >> 2) + 0x20U & 0xffffffffffffffc0;
          (local_90->metrics).vertBearingX = (long)((ulong)xsize * -0x40) >> 1;
          (local_90->metrics).vertBearingY = 0;
          (local_90->metrics).vertAdvance = (pfrsize->metrics).height;
          local_90->bitmap_left = (int)xpos;
          local_90->bitmap_top = (int)ypos + ysize;
          if ((local_84 >> 0x16 & 1) == 0) {
            FVar12 = ft_glyphslot_alloc_bitmap(local_90,(long)iVar11 * uVar34);
            if (FVar12 != 0) break;
            pfr_load_bitmap_bits
                      (local_60,pFVar4->limit,format_00,(byte)pFVar3[1].field_0x4c >> 1 & 1,
                       &local_90->bitmap);
          }
          FT_Stream_ExitFrame(pFVar4);
          goto LAB_00229ae3;
        }
        uVar31 = uVar32 + 1;
        uVar25 = uVar24;
      }
      uVar24 = uVar25;
      uVar13 = (uVar2 - uVar13) + uVar32;
      uVar25 = (uVar24 - uVar31 >> 1) + uVar31;
      uVar32 = uVar13;
      if (uVar13 < uVar31) {
        uVar32 = uVar25;
      }
      if (uVar24 <= uVar13) {
        uVar32 = uVar25;
      }
    } while (uVar31 < uVar24);
  }
  FT_Stream_ExitFrame(pFVar4);
LAB_00229766:
  pFVar8 = local_90;
  if (((uint)load_flags >> 0xe & 1) == 0) {
    lVar14 = pFVar3[2].bbox.xMin;
    lVar16 = (ulong)uVar10 * 0x10;
    local_90->format = FT_GLYPH_FORMAT_OUTLINE;
    (local_90->outline).n_contours = 0;
    (local_90->outline).n_points = 0;
    uVar10 = pFVar3[1].num_fixed_sizes;
    glyph = local_90 + 1;
    pFVar4 = pFVar3->stream;
    local_80 = (byte *)(ulong)*(uint *)(lVar14 + 8 + lVar16);
    uVar30 = *(uint *)(lVar14 + 0xc + lVar16);
    FT_GlyphLoader_Rewind((FT_GlyphLoader)local_90[1].generic.finalizer);
    pFVar8[1].glyph_index = 0;
    FVar9 = pfr_glyph_load_rec((PFR_Glyph)glyph,pFVar4,(ulong)uVar10,(ulong)uVar30,
                               (FT_ULong)local_80);
    pFVar8 = local_90;
    if (FVar9 == 0) {
      outline = &local_90->outline;
      p_Var5 = local_90[1].generic.finalizer;
      *(undefined8 *)&(local_90->outline).flags = *(undefined8 *)(p_Var5 + 0x38);
      uVar6 = *(undefined8 *)(p_Var5 + 0x18);
      pFVar26 = *(FT_Vector **)(p_Var5 + 0x20);
      psVar7 = *(short **)(p_Var5 + 0x30);
      (local_90->outline).tags = *(char **)(p_Var5 + 0x28);
      (local_90->outline).contours = psVar7;
      outline->n_contours = (short)uVar6;
      outline->n_points = (short)((ulong)uVar6 >> 0x10);
      *(int *)&outline->field_0x4 = (int)((ulong)uVar6 >> 0x20);
      (local_90->outline).points = pFVar26;
      uVar10 = (local_90->outline).flags & 0xfffffffa;
      (local_90->outline).flags = uVar10 + 4;
      if ((pfrsize->metrics).y_ppem < 0x18) {
        (local_90->outline).flags = uVar10 | 0x104;
      }
      (local_90->metrics).horiAdvance = 0;
      (local_90->metrics).vertAdvance = 0;
      lVar14 = (long)*(int *)(lVar14 + lVar16 + 4);
      uVar10 = *(uint *)((long)&pFVar3[1].driver + 4);
      if (uVar10 != *(uint *)&pFVar3[1].driver) {
        lVar14 = FT_MulDiv(lVar14,(ulong)*(uint *)&pFVar3[1].driver,(ulong)uVar10);
      }
      if (((ulong)pFVar3[1].autohint.data & 1) == 0) {
        (pFVar8->metrics).horiAdvance = lVar14;
        lVar16 = lVar14;
        lVar14 = (pFVar8->metrics).vertAdvance;
      }
      else {
        (pFVar8->metrics).vertAdvance = lVar14;
        lVar16 = (pFVar8->metrics).horiAdvance;
      }
      pFVar8->linearHoriAdvance = lVar16;
      pFVar8->linearVertAdvance = lVar14;
      (pFVar8->metrics).vertBearingX = 0;
      (pFVar8->metrics).vertBearingY = 0;
      if ((local_84 & 1) == 0) {
        sVar1 = (pFVar8->outline).n_points;
        iVar22 = (int)sVar1;
        iVar19 = (int)(pfrsize->metrics).x_scale;
        iVar11 = (int)(pfrsize->metrics).y_scale;
        if (0 < sVar1) {
          pFVar26 = (pFVar8->outline).points;
          do {
            lVar29 = (long)(int)pFVar26->x * (long)iVar19;
            pFVar26->x = (long)(int)((ulong)(lVar29 + 0x8000 + (lVar29 >> 0x3f)) >> 0x10);
            lVar29 = (long)(int)pFVar26->y * (long)iVar11;
            pFVar26->y = (long)(int)((ulong)(lVar29 + 0x8000 + (lVar29 >> 0x3f)) >> 0x10);
            pFVar26 = pFVar26 + 1;
            iVar22 = iVar22 + -1;
          } while (iVar22 != 0);
        }
        lVar16 = (long)(int)lVar16 * (long)iVar19;
        (pFVar8->metrics).horiAdvance =
             (long)(int)((ulong)(lVar16 + 0x8000 + (lVar16 >> 0x3f)) >> 0x10);
        lVar14 = (long)(int)lVar14 * (long)iVar11;
        (pFVar8->metrics).vertAdvance =
             (long)(int)((ulong)(lVar14 + 0x8000 + (lVar14 >> 0x3f)) >> 0x10);
      }
      FT_Outline_Get_CBox(outline,(FT_BBox *)&xpos);
      (pFVar8->metrics).width = local_48 - xpos;
      (pFVar8->metrics).height = lStack_40 - lStack_50;
      (pFVar8->metrics).horiBearingX = xpos;
      (pFVar8->metrics).horiBearingY = lStack_50;
LAB_00229ae3:
      FVar9 = 0;
    }
  }
  return FVar9;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_slot_load( FT_GlyphSlot  pfrslot,         /* PFR_Slot */
                 FT_Size       pfrsize,         /* PFR_Size */
                 FT_UInt       gindex,
                 FT_Int32      load_flags )
  {
    PFR_Slot     slot    = (PFR_Slot)pfrslot;
    PFR_Size     size    = (PFR_Size)pfrsize;
    FT_Error     error;
    PFR_Face     face    = (PFR_Face)pfrslot->face;
    PFR_Char     gchar;
    FT_Outline*  outline = &pfrslot->outline;
    FT_ULong     gps_offset;


    FT_TRACE1(( "pfr_slot_load: glyph index %d\n", gindex ));

    if ( gindex > 0 )
      gindex--;

    if ( !face || gindex >= face->phy_font.num_chars )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* try to load an embedded bitmap */
    if ( !( load_flags & ( FT_LOAD_NO_SCALE | FT_LOAD_NO_BITMAP ) ) )
    {
      error = pfr_slot_load_bitmap(
                slot,
                size,
                gindex,
                ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
      if ( !error )
        goto Exit;
    }

    if ( load_flags & FT_LOAD_SBITS_ONLY )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    gchar               = face->phy_font.chars + gindex;
    pfrslot->format     = FT_GLYPH_FORMAT_OUTLINE;
    outline->n_points   = 0;
    outline->n_contours = 0;
    gps_offset          = face->header.gps_section_offset;

    /* load the glyph outline (FT_LOAD_NO_RECURSE isn't supported) */
    error = pfr_glyph_load( &slot->glyph, face->root.stream,
                            gps_offset, gchar->gps_offset, gchar->gps_size );

    if ( !error )
    {
      FT_BBox            cbox;
      FT_Glyph_Metrics*  metrics = &pfrslot->metrics;
      FT_Pos             advance;
      FT_UInt            em_metrics, em_outline;
      FT_Bool            scaling;


      scaling = FT_BOOL( !( load_flags & FT_LOAD_NO_SCALE ) );

      /* copy outline data */
      *outline = slot->glyph.loader->base.outline;

      outline->flags &= ~FT_OUTLINE_OWNER;
      outline->flags |= FT_OUTLINE_REVERSE_FILL;

      if ( pfrsize->metrics.y_ppem < 24 )
        outline->flags |= FT_OUTLINE_HIGH_PRECISION;

      /* compute the advance vector */
      metrics->horiAdvance = 0;
      metrics->vertAdvance = 0;

      advance    = gchar->advance;
      em_metrics = face->phy_font.metrics_resolution;
      em_outline = face->phy_font.outline_resolution;

      if ( em_metrics != em_outline )
        advance = FT_MulDiv( advance,
                             (FT_Long)em_outline,
                             (FT_Long)em_metrics );

      if ( face->phy_font.flags & PFR_PHY_VERTICAL )
        metrics->vertAdvance = advance;
      else
        metrics->horiAdvance = advance;

      pfrslot->linearHoriAdvance = metrics->horiAdvance;
      pfrslot->linearVertAdvance = metrics->vertAdvance;

      /* make up vertical metrics(?) */
      metrics->vertBearingX = 0;
      metrics->vertBearingY = 0;

#if 0 /* some fonts seem to be broken here! */

      /* Apply the font matrix, if any.                 */
      /* TODO: Test existing fonts with unusual matrix  */
      /* whether we have to adjust Units per EM.        */
      {
        FT_Matrix font_matrix;


        font_matrix.xx = face->log_font.matrix[0] << 8;
        font_matrix.yx = face->log_font.matrix[1] << 8;
        font_matrix.xy = face->log_font.matrix[2] << 8;
        font_matrix.yy = face->log_font.matrix[3] << 8;

        FT_Outline_Transform( outline, &font_matrix );
      }
#endif

      /* scale when needed */
      if ( scaling )
      {
        FT_Int      n;
        FT_Fixed    x_scale = pfrsize->metrics.x_scale;
        FT_Fixed    y_scale = pfrsize->metrics.y_scale;
        FT_Vector*  vec     = outline->points;


        /* scale outline points */
        for ( n = 0; n < outline->n_points; n++, vec++ )
        {
          vec->x = FT_MulFix( vec->x, x_scale );
          vec->y = FT_MulFix( vec->y, y_scale );
        }

        /* scale the advance */
        metrics->horiAdvance = FT_MulFix( metrics->horiAdvance, x_scale );
        metrics->vertAdvance = FT_MulFix( metrics->vertAdvance, y_scale );
      }

      /* compute the rest of the metrics */
      FT_Outline_Get_CBox( outline, &cbox );

      metrics->width        = cbox.xMax - cbox.xMin;
      metrics->height       = cbox.yMax - cbox.yMin;
      metrics->horiBearingX = cbox.xMin;
      metrics->horiBearingY = cbox.yMax - metrics->height;
    }

  Exit:
    return error;
  }